

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

double __thiscall ipx::Basis::MinSingularValue(Basis *this)

{
  long in_RDI;
  double dVar1;
  valarray<double> *this_00;
  Vector *in_stack_00000038;
  double lambda;
  Vector v;
  Int m;
  size_t in_stack_ffffffffffffff98;
  valarray<double> *in_stack_ffffffffffffffa0;
  
  Model::rows(*(Model **)(in_RDI + 8));
  std::valarray<double>::valarray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  dVar1 = PowerMethod<ipx::Basis::MinSingularValue()const::__0>
                    ((anon_class_8_1_8991fb9c)lambda,in_stack_00000038);
  this_00 = (valarray<double> *)sqrt(1.0 / dVar1);
  std::valarray<double>::~valarray(this_00);
  return (double)this_00;
}

Assistant:

double Basis::MinSingularValue() const {
    const Int m = model_.rows();
    Vector v(m);

    // Computes maximum eigenvalue of inverse(B*B').
    double lambda = PowerMethod(
        [this](const Vector& x, Vector& fx) {
            SolveDense(x, fx, 'N');
            SolveDense(fx, fx, 'T'); }, v);
    return std::sqrt(1.0/lambda);
}